

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  float fVar72;
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar79;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  auVar4 = *(undefined1 (*) [16])(pcVar7 + uVar5 * sVar8);
  lVar49 = (uVar5 + 1) * sVar8;
  auVar57 = *(undefined1 (*) [16])(pcVar7 + lVar49);
  lVar50 = (uVar5 + 2) * sVar8;
  auVar56 = *(undefined1 (*) [16])(pcVar7 + lVar50);
  lVar51 = (uVar5 + 3) * sVar8;
  auVar54 = *(undefined1 (*) [16])(pcVar7 + lVar51);
  auVar71 = ZEXT1664(auVar54);
  fVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar9 = fVar3 * *(float *)(pcVar7 + uVar5 * sVar8 + 0xc);
  auVar68 = ZEXT464((uint)fVar9);
  fVar10 = fVar3 * *(float *)(pcVar7 + lVar49 + 0xc);
  fVar11 = fVar3 * *(float *)(pcVar7 + lVar50 + 0xc);
  auVar66 = ZEXT464((uint)fVar11);
  fVar3 = fVar3 * *(float *)(pcVar7 + lVar51 + 0xc);
  uVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar47 = (ulong)uVar5;
  auVar63 = ZEXT416((uint)fVar11);
  if (uVar47 == 4) {
    auVar13 = vshufps_avx(auVar54,auVar54,0);
    auVar58 = vshufps_avx(auVar54,auVar54,0x55);
    auVar55 = vshufps_avx(auVar54,auVar54,0xaa);
    auVar14 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
    auVar52 = vshufps_avx(auVar56,auVar56,0);
    auVar15 = vshufps_avx(auVar56,auVar56,0x55);
    auVar54 = vinsertps_avx(auVar56,ZEXT416((uint)fVar11),0x30);
    auVar56 = vshufps_avx(auVar56,auVar56,0xaa);
    auVar16 = vshufps_avx(ZEXT416((uint)fVar11),auVar63,0);
    auVar63 = vshufps_avx(auVar57,auVar57,0);
    auVar17 = vshufps_avx(auVar57,auVar57,0x55);
    auVar57 = vshufps_avx(auVar57,auVar57,0xaa);
    auVar69 = vshufps_avx(auVar4,auVar4,0);
    auVar18 = vshufps_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),0);
    auVar19 = vshufps_avx(auVar4,auVar4,0x55);
    auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
    auVar20 = vshufps_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),0);
    auVar64._0_4_ =
         auVar63._0_4_ * (float)catmullrom_basis0._1428_4_ +
         auVar13._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar52._0_4_ +
         (float)catmullrom_basis0._272_4_ * auVar69._0_4_;
    auVar64._4_4_ =
         auVar63._4_4_ * (float)catmullrom_basis0._1432_4_ +
         auVar13._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar52._4_4_ +
         (float)catmullrom_basis0._276_4_ * auVar69._4_4_;
    auVar64._8_4_ =
         auVar63._8_4_ * (float)catmullrom_basis0._1436_4_ +
         auVar13._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar52._8_4_ +
         (float)catmullrom_basis0._280_4_ * auVar69._8_4_;
    auVar64._12_4_ =
         auVar63._12_4_ * (float)catmullrom_basis0._1440_4_ +
         auVar13._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar52._12_4_ +
         (float)catmullrom_basis0._284_4_ * auVar69._12_4_;
    auVar69._0_4_ =
         auVar17._0_4_ * (float)catmullrom_basis0._1428_4_ +
         auVar58._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar15._0_4_ +
         auVar19._0_4_ * (float)catmullrom_basis0._272_4_;
    auVar69._4_4_ =
         auVar17._4_4_ * (float)catmullrom_basis0._1432_4_ +
         auVar58._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar15._4_4_ +
         auVar19._4_4_ * (float)catmullrom_basis0._276_4_;
    auVar69._8_4_ =
         auVar17._8_4_ * (float)catmullrom_basis0._1436_4_ +
         auVar58._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar15._8_4_ +
         auVar19._8_4_ * (float)catmullrom_basis0._280_4_;
    auVar69._12_4_ =
         auVar17._12_4_ * (float)catmullrom_basis0._1440_4_ +
         auVar58._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar15._12_4_ +
         auVar19._12_4_ * (float)catmullrom_basis0._284_4_;
    auVar52._0_4_ =
         (float)catmullrom_basis0._272_4_ * auVar4._0_4_ +
         (float)catmullrom_basis0._1428_4_ * auVar57._0_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar56._0_4_ +
         auVar55._0_4_ * (float)catmullrom_basis0._3740_4_;
    auVar52._4_4_ =
         (float)catmullrom_basis0._276_4_ * auVar4._4_4_ +
         (float)catmullrom_basis0._1432_4_ * auVar57._4_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar56._4_4_ +
         auVar55._4_4_ * (float)catmullrom_basis0._3744_4_;
    auVar52._8_4_ =
         (float)catmullrom_basis0._280_4_ * auVar4._8_4_ +
         (float)catmullrom_basis0._1436_4_ * auVar57._8_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar56._8_4_ +
         auVar55._8_4_ * (float)catmullrom_basis0._3748_4_;
    auVar52._12_4_ =
         (float)catmullrom_basis0._284_4_ * auVar4._12_4_ +
         (float)catmullrom_basis0._1440_4_ * auVar57._12_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar56._12_4_ +
         auVar55._12_4_ * (float)catmullrom_basis0._3752_4_;
    auVar55._0_4_ =
         (float)catmullrom_basis0._272_4_ * auVar20._0_4_ +
         (float)catmullrom_basis0._1428_4_ * auVar18._0_4_ +
         auVar14._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar16._0_4_;
    auVar55._4_4_ =
         (float)catmullrom_basis0._276_4_ * auVar20._4_4_ +
         (float)catmullrom_basis0._1432_4_ * auVar18._4_4_ +
         auVar14._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar16._4_4_;
    auVar55._8_4_ =
         (float)catmullrom_basis0._280_4_ * auVar20._8_4_ +
         (float)catmullrom_basis0._1436_4_ * auVar18._8_4_ +
         auVar14._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar16._8_4_;
    auVar55._12_4_ =
         (float)catmullrom_basis0._284_4_ * auVar20._12_4_ +
         (float)catmullrom_basis0._1440_4_ * auVar18._12_4_ +
         auVar14._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar16._12_4_;
    auVar63 = vshufps_avx(auVar64,auVar64,0xb1);
    auVar4 = vminps_avx(auVar63,auVar64);
    auVar57 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vminps_avx(auVar57,auVar4);
    auVar13 = vshufps_avx(auVar69,auVar69,0xb1);
    auVar57 = vminps_avx(auVar13,auVar69);
    auVar56 = vshufpd_avx(auVar57,auVar57,1);
    auVar57 = vminps_avx(auVar56,auVar57);
    auVar4 = vinsertps_avx(auVar4,auVar57,0x1c);
    auVar58 = vshufps_avx(auVar52,auVar52,0xb1);
    auVar57 = vminps_avx(auVar58,auVar52);
    auVar56 = vshufpd_avx(auVar57,auVar57,1);
    auVar57 = vminps_avx(auVar56,auVar57);
    auVar57 = vinsertps_avx(auVar4,auVar57,0x20);
    auVar4 = vmaxps_avx(auVar63,auVar64);
    auVar56 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vmaxps_avx(auVar56,auVar4);
    auVar56 = vmaxps_avx(auVar13,auVar69);
    auVar63 = vshufpd_avx(auVar56,auVar56,1);
    auVar56 = vmaxps_avx(auVar63,auVar56);
    auVar4 = vinsertps_avx(auVar4,auVar56,0x1c);
    auVar56 = vmaxps_avx(auVar58,auVar52);
    auVar63 = vshufpd_avx(auVar56,auVar56,1);
    auVar56 = vmaxps_avx(auVar63,auVar56);
    auVar56 = vinsertps_avx(auVar4,auVar56,0x20);
    auVar58._8_4_ = 0x7fffffff;
    auVar58._0_8_ = 0x7fffffff7fffffff;
    auVar58._12_4_ = 0x7fffffff;
    auVar4 = vandps_avx(auVar55,auVar58);
    auVar63 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vmaxps_avx(auVar63,auVar4);
    auVar63 = vshufps_avx(auVar4,auVar4,0);
    auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
    auVar63 = vmaxps_avx(auVar4,auVar63);
    auVar13 = vminps_avx(auVar57,auVar54);
    auVar57 = vmaxps_avx(auVar56,auVar54);
    auVar4 = vandps_avx(auVar16,auVar58);
    auVar56 = vmaxps_avx(auVar63,auVar4);
    auVar4 = vsubps_avx(auVar13,auVar56);
    auVar54._0_4_ = auVar57._0_4_ + auVar56._0_4_;
    auVar54._4_4_ = auVar57._4_4_ + auVar56._4_4_;
    auVar54._8_4_ = auVar57._8_4_ + auVar56._8_4_;
    auVar54._12_4_ = auVar57._12_4_ + auVar56._12_4_;
  }
  else {
    if ((int)uVar5 < 0) {
      auVar73._8_4_ = 0x7f800000;
      auVar73._0_8_ = 0x7f8000007f800000;
      auVar73._12_4_ = 0x7f800000;
      auVar73._16_4_ = 0x7f800000;
      auVar73._20_4_ = 0x7f800000;
      auVar73._24_4_ = 0x7f800000;
      auVar73._28_4_ = 0x7f800000;
      auVar78._8_4_ = 0xff800000;
      auVar78._0_8_ = 0xff800000ff800000;
      auVar78._12_4_ = 0xff800000;
      auVar78._16_4_ = 0xff800000;
      auVar78._20_4_ = 0xff800000;
      auVar78._24_4_ = 0xff800000;
      auVar78._28_4_ = 0xff800000;
      auVar61 = ZEXT832(0) << 0x20;
      auVar74 = auVar73;
      auVar75 = auVar73;
      auVar76 = auVar78;
      auVar62 = auVar78;
    }
    else {
      auVar13 = vpshufd_avx(ZEXT416(uVar5),0);
      auVar58 = vshufps_avx(auVar4,auVar4,0);
      auVar55 = vshufps_avx(auVar4,auVar4,0x55);
      auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
      auVar14 = vshufps_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),0);
      auVar52 = vshufps_avx(auVar57,auVar57,0);
      auVar15 = vshufps_avx(auVar57,auVar57,0x55);
      auVar59._16_16_ = auVar15;
      auVar59._0_16_ = auVar15;
      auVar57 = vshufps_avx(auVar57,auVar57,0xaa);
      auVar16 = vshufps_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),0);
      auVar17 = vshufps_avx(auVar56,auVar56,0);
      auVar69 = vshufps_avx(auVar56,auVar56,0x55);
      auVar56 = vshufps_avx(auVar56,auVar56,0xaa);
      auVar63 = vshufps_avx(auVar63,auVar63,0);
      auVar18 = vshufps_avx(auVar54,auVar54,0);
      auVar19 = vshufps_avx(auVar54,auVar54,0x55);
      auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
      auVar20 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      lVar49 = uVar47 * 0x44;
      uVar48 = 0;
      auVar53 = ZEXT864(0) << 0x20;
      auVar62._8_4_ = 0xff800000;
      auVar62._0_8_ = 0xff800000ff800000;
      auVar62._12_4_ = 0xff800000;
      auVar62._16_4_ = 0xff800000;
      auVar62._20_4_ = 0xff800000;
      auVar62._24_4_ = 0xff800000;
      auVar62._28_4_ = 0xff800000;
      auVar74._8_4_ = 0x7f800000;
      auVar74._0_8_ = 0x7f8000007f800000;
      auVar74._12_4_ = 0x7f800000;
      auVar74._16_4_ = 0x7f800000;
      auVar74._20_4_ = 0x7f800000;
      auVar74._24_4_ = 0x7f800000;
      auVar74._28_4_ = 0x7f800000;
      auVar73 = auVar74;
      auVar75 = auVar74;
      auVar76 = auVar62;
      auVar78 = auVar62;
      do {
        auVar12 = vpshufd_avx(ZEXT416((uint)uVar48),0);
        auVar64 = vpor_avx(auVar12,_DAT_01f7fcf0);
        auVar12 = vpor_avx(auVar12,_DAT_01fafea0);
        auVar64 = vpcmpgtd_avx(auVar64,auVar13);
        auVar12 = vpcmpgtd_avx(auVar12,auVar13);
        auVar77._16_16_ = auVar12;
        auVar77._0_16_ = auVar64;
        pfVar1 = (float *)(lVar49 + 0x21b3c74 + uVar48 * 4);
        fVar3 = *pfVar1;
        fVar9 = pfVar1[1];
        fVar10 = pfVar1[2];
        fVar11 = pfVar1[3];
        fVar22 = pfVar1[4];
        fVar23 = pfVar1[5];
        fVar24 = pfVar1[6];
        pfVar2 = (float *)(lVar49 + 0x21b40f8 + uVar48 * 4);
        fVar25 = *pfVar2;
        fVar26 = pfVar2[1];
        fVar27 = pfVar2[2];
        fVar28 = pfVar2[3];
        fVar29 = pfVar2[4];
        fVar30 = pfVar2[5];
        fVar31 = pfVar2[6];
        fVar32 = pfVar2[7];
        local_1a8 = auVar18._0_4_;
        fStack_1a4 = auVar18._4_4_;
        fStack_1a0 = auVar18._8_4_;
        fStack_19c = auVar18._12_4_;
        local_1c8 = auVar19._0_4_;
        fStack_1c4 = auVar19._4_4_;
        fStack_1c0 = auVar19._8_4_;
        fStack_1bc = auVar19._12_4_;
        local_1e8 = auVar54._0_4_;
        fStack_1e4 = auVar54._4_4_;
        fStack_1e0 = auVar54._8_4_;
        fStack_1dc = auVar54._12_4_;
        local_128 = auVar17._0_4_;
        fStack_124 = auVar17._4_4_;
        fStack_120 = auVar17._8_4_;
        fStack_11c = auVar17._12_4_;
        fVar72 = auVar71._28_4_;
        local_148 = auVar69._0_4_;
        fStack_144 = auVar69._4_4_;
        fStack_140 = auVar69._8_4_;
        fStack_13c = auVar69._12_4_;
        local_168 = auVar56._0_4_;
        fStack_164 = auVar56._4_4_;
        fStack_160 = auVar56._8_4_;
        fStack_15c = auVar56._12_4_;
        pfVar2 = (float *)(lVar49 + 0x21b37f0 + uVar48 * 4);
        fVar33 = *pfVar2;
        fVar34 = pfVar2[1];
        fVar35 = pfVar2[2];
        fVar36 = pfVar2[3];
        fVar37 = pfVar2[4];
        fVar38 = pfVar2[5];
        fVar39 = pfVar2[6];
        local_188 = auVar63._0_4_;
        fStack_184 = auVar63._4_4_;
        fStack_180 = auVar63._8_4_;
        fStack_17c = auVar63._12_4_;
        fVar79 = pfVar1[7] + fVar32;
        local_a8 = auVar52._0_4_;
        fStack_a4 = auVar52._4_4_;
        fStack_a0 = auVar52._8_4_;
        fStack_9c = auVar52._12_4_;
        local_c8 = auVar15._0_4_;
        fStack_c4 = auVar15._4_4_;
        fStack_c0 = auVar15._8_4_;
        fStack_bc = auVar15._12_4_;
        local_e8 = auVar57._0_4_;
        fStack_e4 = auVar57._4_4_;
        fStack_e0 = auVar57._8_4_;
        fStack_dc = auVar57._12_4_;
        pfVar1 = (float *)(catmullrom_basis0 + uVar48 * 4 + lVar49);
        fVar40 = *pfVar1;
        fVar41 = pfVar1[1];
        fVar42 = pfVar1[2];
        fVar43 = pfVar1[3];
        fVar44 = pfVar1[4];
        fVar45 = pfVar1[5];
        fVar46 = pfVar1[6];
        local_108 = auVar16._0_4_;
        fStack_104 = auVar16._4_4_;
        fStack_100 = auVar16._8_4_;
        fStack_fc = auVar16._12_4_;
        local_28 = auVar58._0_4_;
        fStack_24 = auVar58._4_4_;
        fStack_20 = auVar58._8_4_;
        fStack_1c = auVar58._12_4_;
        auVar60._0_4_ =
             fVar40 * local_28 + fVar33 * local_a8 + fVar3 * local_128 + fVar25 * local_1a8;
        auVar60._4_4_ =
             fVar41 * fStack_24 + fVar34 * fStack_a4 + fVar9 * fStack_124 + fVar26 * fStack_1a4;
        auVar60._8_4_ =
             fVar42 * fStack_20 + fVar35 * fStack_a0 + fVar10 * fStack_120 + fVar27 * fStack_1a0;
        auVar60._12_4_ =
             fVar43 * fStack_1c + fVar36 * fStack_9c + fVar11 * fStack_11c + fVar28 * fStack_19c;
        auVar60._16_4_ =
             fVar44 * local_28 + fVar37 * local_a8 + fVar22 * local_128 + fVar29 * local_1a8;
        auVar60._20_4_ =
             fVar45 * fStack_24 + fVar38 * fStack_a4 + fVar23 * fStack_124 + fVar30 * fStack_1a4;
        auVar60._24_4_ =
             fVar46 * fStack_20 + fVar39 * fStack_a0 + fVar24 * fStack_120 + fVar31 * fStack_1a0;
        auVar60._28_4_ = fVar79 + fVar32 + fVar72 + auVar59._28_4_;
        local_48 = auVar55._0_4_;
        fStack_44 = auVar55._4_4_;
        fStack_40 = auVar55._8_4_;
        fStack_3c = auVar55._12_4_;
        auVar65._0_4_ =
             fVar40 * local_48 + fVar33 * local_c8 + fVar3 * local_148 + fVar25 * local_1c8;
        auVar65._4_4_ =
             fVar41 * fStack_44 + fVar34 * fStack_c4 + fVar9 * fStack_144 + fVar26 * fStack_1c4;
        auVar65._8_4_ =
             fVar42 * fStack_40 + fVar35 * fStack_c0 + fVar10 * fStack_140 + fVar27 * fStack_1c0;
        auVar65._12_4_ =
             fVar43 * fStack_3c + fVar36 * fStack_bc + fVar11 * fStack_13c + fVar28 * fStack_1bc;
        auVar65._16_4_ =
             fVar44 * local_48 + fVar37 * local_c8 + fVar22 * local_148 + fVar29 * local_1c8;
        auVar65._20_4_ =
             fVar45 * fStack_44 + fVar38 * fStack_c4 + fVar23 * fStack_144 + fVar30 * fStack_1c4;
        auVar65._24_4_ =
             fVar46 * fStack_40 + fVar39 * fStack_c0 + fVar24 * fStack_140 + fVar31 * fStack_1c0;
        auVar65._28_4_ = fVar79 + fVar32 + fVar72 + auVar66._28_4_;
        auVar66 = ZEXT3264(auVar65);
        auVar61 = vminps_avx(auVar73,auVar60);
        auVar73 = vblendvps_avx(auVar61,auVar73,auVar77);
        local_68 = auVar4._0_4_;
        fStack_64 = auVar4._4_4_;
        fStack_60 = auVar4._8_4_;
        fStack_5c = auVar4._12_4_;
        auVar67._0_4_ =
             fVar40 * local_68 + fVar33 * local_e8 + fVar3 * local_168 + fVar25 * local_1e8;
        auVar67._4_4_ =
             fVar41 * fStack_64 + fVar34 * fStack_e4 + fVar9 * fStack_164 + fVar26 * fStack_1e4;
        auVar67._8_4_ =
             fVar42 * fStack_60 + fVar35 * fStack_e0 + fVar10 * fStack_160 + fVar27 * fStack_1e0;
        auVar67._12_4_ =
             fVar43 * fStack_5c + fVar36 * fStack_dc + fVar11 * fStack_15c + fVar28 * fStack_1dc;
        auVar67._16_4_ =
             fVar44 * local_68 + fVar37 * local_e8 + fVar22 * local_168 + fVar29 * local_1e8;
        auVar67._20_4_ =
             fVar45 * fStack_64 + fVar38 * fStack_e4 + fVar23 * fStack_164 + fVar30 * fStack_1e4;
        auVar67._24_4_ =
             fVar46 * fStack_60 + fVar39 * fStack_e0 + fVar24 * fStack_160 + fVar31 * fStack_1e0;
        auVar67._28_4_ = auVar61._28_4_ + fVar32 + fVar72 + auVar68._28_4_;
        auVar68 = ZEXT3264(auVar67);
        auVar61 = vminps_avx(auVar74,auVar65);
        auVar74 = vblendvps_avx(auVar61,auVar74,auVar77);
        auVar61 = vminps_avx(auVar75,auVar67);
        auVar75 = vblendvps_avx(auVar61,auVar75,auVar77);
        local_88 = auVar14._0_4_;
        fStack_84 = auVar14._4_4_;
        fStack_80 = auVar14._8_4_;
        fStack_7c = auVar14._12_4_;
        auVar70._0_4_ =
             fVar40 * local_88 + fVar3 * local_188 + auVar20._0_4_ * fVar25 + fVar33 * local_108;
        auVar70._4_4_ =
             fVar41 * fStack_84 + fVar9 * fStack_184 + auVar20._4_4_ * fVar26 + fVar34 * fStack_104;
        auVar70._8_4_ =
             fVar42 * fStack_80 + fVar10 * fStack_180 + auVar20._8_4_ * fVar27 + fVar35 * fStack_100
        ;
        auVar70._12_4_ =
             fVar43 * fStack_7c + fVar11 * fStack_17c + auVar20._12_4_ * fVar28 + fVar36 * fStack_fc
        ;
        auVar70._16_4_ =
             fVar44 * local_88 + fVar22 * local_188 + auVar20._0_4_ * fVar29 + fVar37 * local_108;
        auVar70._20_4_ =
             fVar45 * fStack_84 + fVar23 * fStack_184 + auVar20._4_4_ * fVar30 + fVar38 * fStack_104
        ;
        auVar70._24_4_ =
             fVar46 * fStack_80 + fVar24 * fStack_180 + auVar20._8_4_ * fVar31 + fVar39 * fStack_100
        ;
        auVar70._28_4_ = auVar61._28_4_ + fVar79 + pfVar2[7];
        auVar71 = ZEXT3264(auVar70);
        auVar61 = vmaxps_avx(auVar78,auVar60);
        auVar78 = vblendvps_avx(auVar61,auVar78,auVar77);
        auVar61 = vmaxps_avx(auVar76,auVar65);
        auVar76 = vblendvps_avx(auVar61,auVar76,auVar77);
        auVar61 = vmaxps_avx(auVar62,auVar67);
        auVar62 = vblendvps_avx(auVar61,auVar62,auVar77);
        auVar61._8_4_ = 0x7fffffff;
        auVar61._0_8_ = 0x7fffffff7fffffff;
        auVar61._12_4_ = 0x7fffffff;
        auVar61._16_4_ = 0x7fffffff;
        auVar61._20_4_ = 0x7fffffff;
        auVar61._24_4_ = 0x7fffffff;
        auVar61._28_4_ = 0x7fffffff;
        auVar61 = vandps_avx(auVar70,auVar61);
        auVar59 = vmaxps_avx(auVar53._0_32_,auVar61);
        auVar61 = vblendvps_avx(auVar59,auVar53._0_32_,auVar77);
        auVar53 = ZEXT3264(auVar61);
        uVar48 = uVar48 + 8;
      } while (uVar48 <= uVar47);
    }
    auVar59 = vshufps_avx(auVar73,auVar73,0xb1);
    auVar73 = vminps_avx(auVar73,auVar59);
    auVar59 = vshufpd_avx(auVar73,auVar73,5);
    auVar73 = vminps_avx(auVar73,auVar59);
    auVar4 = vminps_avx(auVar73._0_16_,auVar73._16_16_);
    auVar73 = vshufps_avx(auVar74,auVar74,0xb1);
    auVar73 = vminps_avx(auVar74,auVar73);
    auVar74 = vshufpd_avx(auVar73,auVar73,5);
    auVar73 = vminps_avx(auVar73,auVar74);
    auVar57 = vminps_avx(auVar73._0_16_,auVar73._16_16_);
    auVar57 = vunpcklps_avx(auVar4,auVar57);
    auVar73 = vshufps_avx(auVar75,auVar75,0xb1);
    auVar73 = vminps_avx(auVar75,auVar73);
    auVar74 = vshufpd_avx(auVar73,auVar73,5);
    auVar73 = vminps_avx(auVar73,auVar74);
    auVar4 = vminps_avx(auVar73._0_16_,auVar73._16_16_);
    auVar4 = vinsertps_avx(auVar57,auVar4,0x28);
    auVar73 = vshufps_avx(auVar78,auVar78,0xb1);
    auVar73 = vmaxps_avx(auVar78,auVar73);
    auVar74 = vshufpd_avx(auVar73,auVar73,5);
    auVar73 = vmaxps_avx(auVar73,auVar74);
    auVar57 = vmaxps_avx(auVar73._0_16_,auVar73._16_16_);
    auVar73 = vshufps_avx(auVar76,auVar76,0xb1);
    auVar73 = vmaxps_avx(auVar76,auVar73);
    auVar74 = vshufpd_avx(auVar73,auVar73,5);
    auVar73 = vmaxps_avx(auVar73,auVar74);
    auVar56 = vmaxps_avx(auVar73._0_16_,auVar73._16_16_);
    auVar56 = vunpcklps_avx(auVar57,auVar56);
    auVar73 = vshufps_avx(auVar62,auVar62,0xb1);
    auVar73 = vmaxps_avx(auVar62,auVar73);
    auVar74 = vshufpd_avx(auVar73,auVar73,5);
    auVar73 = vmaxps_avx(auVar73,auVar74);
    auVar57 = vmaxps_avx(auVar73._0_16_,auVar73._16_16_);
    auVar57 = vinsertps_avx(auVar56,auVar57,0x28);
    auVar73 = vshufps_avx(auVar61,auVar61,0xb1);
    auVar73 = vmaxps_avx(auVar61,auVar73);
    auVar74 = vshufpd_avx(auVar73,auVar73,5);
    auVar73 = vmaxps_avx(auVar73,auVar74);
    auVar56 = vmaxps_avx(auVar73._0_16_,auVar73._16_16_);
    auVar56 = vshufps_avx(auVar56,auVar56,0);
    auVar4 = vsubps_avx(auVar4,auVar56);
    auVar54._0_4_ = auVar57._0_4_ + auVar56._0_4_;
    auVar54._4_4_ = auVar57._4_4_ + auVar56._4_4_;
    auVar54._8_4_ = auVar57._8_4_ + auVar56._8_4_;
    auVar54._12_4_ = auVar57._12_4_ + auVar56._12_4_;
  }
  auVar56._8_4_ = 0x7fffffff;
  auVar56._0_8_ = 0x7fffffff7fffffff;
  auVar56._12_4_ = 0x7fffffff;
  auVar57 = vandps_avx(auVar4,auVar56);
  auVar56 = vandps_avx(auVar54,auVar56);
  auVar57 = vmaxps_avx(auVar57,auVar56);
  auVar56 = vmovshdup_avx(auVar57);
  auVar56 = vmaxss_avx(auVar56,auVar57);
  auVar57 = vshufpd_avx(auVar57,auVar57,1);
  auVar57 = vmaxss_avx(auVar57,auVar56);
  auVar57 = ZEXT416((uint)(auVar57._0_4_ * 4.7683716e-07));
  auVar57 = vshufps_avx(auVar57,auVar57,0);
  aVar21 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar4,auVar57);
  (__return_storage_ptr__->lower).field_0 = aVar21;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar54._0_4_ + auVar57._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar54._4_4_ + auVar57._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar54._8_4_ + auVar57._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar54._12_4_ + auVar57._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }